

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntOverflowDoesNotMatterRange.h
# Opt level: O1

void __thiscall
IntOverflowDoesNotMatterRange::IntOverflowDoesNotMatterRange
          (IntOverflowDoesNotMatterRange *this,JitArenaAllocator *allocator,Instr *firstInstr,
          Instr *lastInstr,IntOverflowDoesNotMatterRange *next)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  this->firstInstr = firstInstr;
  this->lastInstr = lastInstr;
  (this->symsRequiredToBeInt).head = (Type_conflict)0x0;
  (this->symsRequiredToBeInt).lastFoundIndex = (Type_conflict)0x0;
  (this->symsRequiredToBeInt).alloc = allocator;
  (this->symsRequiredToBeInt).lastUsedNodePrevNextField = &(this->symsRequiredToBeInt).head;
  (this->symsRequiredToBeLossyInt).head = (Type_conflict)0x0;
  (this->symsRequiredToBeLossyInt).lastFoundIndex = (Type_conflict)0x0;
  (this->symsRequiredToBeLossyInt).alloc = allocator;
  (this->symsRequiredToBeLossyInt).lastUsedNodePrevNextField =
       &(this->symsRequiredToBeLossyInt).head;
  this->next = next;
  if (firstInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntOverflowDoesNotMatterRange.h"
                       ,0x20,"(firstInstr)","firstInstr");
    if (!bVar2) goto LAB_003f69b1;
    *puVar3 = 0;
  }
  if (lastInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntOverflowDoesNotMatterRange.h"
                       ,0x21,"(lastInstr)","lastInstr");
    if (!bVar2) goto LAB_003f69b1;
    *puVar3 = 0;
  }
  if (lastInstr->m_opcode != NoIntOverflowBoundary) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntOverflowDoesNotMatterRange.h"
                       ,0x22,"(lastInstr->m_opcode == Js::OpCode::NoIntOverflowBoundary)",
                       "lastInstr->m_opcode == Js::OpCode::NoIntOverflowBoundary");
    if (!bVar2) {
LAB_003f69b1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

IntOverflowDoesNotMatterRange(
        JitArenaAllocator *const allocator,
        IR::Instr *const firstInstr,
        IR::Instr *const lastInstr,
        IntOverflowDoesNotMatterRange *const next)
        : firstInstr(firstInstr),
        lastInstr(lastInstr),
        symsRequiredToBeInt(allocator),
        symsRequiredToBeLossyInt(allocator),
        next(next)
    {
        Assert(firstInstr);
        Assert(lastInstr);
        Assert(lastInstr->m_opcode == Js::OpCode::NoIntOverflowBoundary);
    }